

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,string *linkLibs,string *flags,string *linkFlags,
          string *frameworkPath,string *linkPath,cmGeneratorTarget *target,bool useWatcomQuote)

{
  cmMakefile *pcVar1;
  cmSourceFile *this_00;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  string *psVar5;
  _Alloc_hider _Var6;
  allocator local_129;
  string sFlagVar;
  string linkLanguage;
  allocator local_dd;
  uint local_dc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string buildType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&linkLanguage,"CMAKE_BUILD_TYPE",(allocator *)&sFlagVar);
  pcVar4 = cmMakefile::GetSafeDefinition(pcVar1,&linkLanguage);
  std::__cxx11::string::string((string *)&buildType,pcVar4,(allocator *)&local_d8);
  std::__cxx11::string::~string((string *)&linkLanguage);
  cmsys::SystemTools::UpperCase(&linkLanguage,&buildType);
  std::__cxx11::string::operator=((string *)&buildType,(string *)&linkLanguage);
  std::__cxx11::string::~string((string *)&linkLanguage);
  uVar3 = cmGeneratorTarget::GetType(target);
  if (3 < uVar3) goto LAB_0032bc06;
  local_dc = (uint)useWatcomQuote;
  switch(uVar3) {
  case 0:
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS",(allocator *)&sFlagVar);
    cmMakefile::GetSafeDefinition(pcVar1,&linkLanguage);
    std::__cxx11::string::append((char *)linkFlags);
    std::__cxx11::string::~string((string *)&linkLanguage);
    std::__cxx11::string::append((char *)linkFlags);
    if (buildType._M_string_length != 0) {
      std::__cxx11::string::string
                ((string *)&linkLanguage,"CMAKE_EXE_LINKER_FLAGS_",(allocator *)&sFlagVar);
      std::__cxx11::string::append((string *)&linkLanguage);
      cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::~string((string *)&linkLanguage);
    }
    cmTarget::GetLinkerLanguage(&linkLanguage,target->Target,&buildType);
    if (linkLanguage._M_string_length == 0) {
      cmSystemTools::Error
                ("CMake can not determine linker language for target: ",
                 (target->Target->Name)._M_dataplus._M_p,(char *)0x0,(char *)0x0);
    }
    else {
      AddLanguageFlags(this,flags,&linkLanguage,&buildType);
      OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,SUB41(local_dc,0))
      ;
      pcVar1 = this->Makefile;
      std::__cxx11::string::string((string *)&sFlagVar,"BUILD_SHARED_LIBS",(allocator *)&local_d8);
      pcVar4 = cmMakefile::GetDefinition(pcVar1,&sFlagVar);
      bVar2 = cmSystemTools::IsOn(pcVar4);
      std::__cxx11::string::~string((string *)&sFlagVar);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_50,"CMAKE_SHARED_BUILD_",&local_129);
        std::operator+(&local_d8,&local_50,&linkLanguage);
        std::__cxx11::string::string((string *)&local_70,"_FLAGS",&local_dd);
        std::operator+(&sFlagVar,&local_d8,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_50);
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::~string((string *)&sFlagVar);
      }
      std::__cxx11::string::string((string *)&sFlagVar,"WIN32_EXECUTABLE",(allocator *)&local_d8);
      bVar2 = cmGeneratorTarget::GetPropertyAsBool(target,&sFlagVar);
      std::__cxx11::string::~string((string *)&sFlagVar);
      pcVar1 = this->Makefile;
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&sFlagVar,"CMAKE_CREATE_WIN32_EXE",(allocator *)&local_d8);
        cmMakefile::GetSafeDefinition(pcVar1,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      else {
        std::__cxx11::string::string
                  ((string *)&sFlagVar,"CMAKE_CREATE_CONSOLE_EXE",(allocator *)&local_d8);
        cmMakefile::GetSafeDefinition(pcVar1,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
      }
      std::__cxx11::string::~string((string *)&sFlagVar);
      std::__cxx11::string::append((char *)linkFlags);
      bVar2 = cmTarget::IsExecutableWithExports(target->Target);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&sFlagVar,"CMAKE_EXE_EXPORTS_",(allocator *)&local_d8);
        std::__cxx11::string::append((string *)&sFlagVar);
        std::__cxx11::string::append((char *)&sFlagVar);
        cmMakefile::GetSafeDefinition(this->Makefile,&sFlagVar);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::~string((string *)&sFlagVar);
      }
      std::__cxx11::string::string((string *)&sFlagVar,"LINK_FLAGS",(allocator *)&local_d8);
      pcVar4 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
      std::__cxx11::string::~string((string *)&sFlagVar);
      if (pcVar4 != (char *)0x0) {
        std::__cxx11::string::append((char *)linkFlags);
        std::__cxx11::string::append((char *)linkFlags);
      }
      if (buildType._M_string_length != 0) {
        std::__cxx11::string::string((string *)&sFlagVar,"LINK_FLAGS_",(allocator *)&local_d8);
        std::__cxx11::string::append((string *)&sFlagVar);
        pcVar4 = cmGeneratorTarget::GetProperty(target,&sFlagVar);
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::append((char *)linkFlags);
          std::__cxx11::string::append((char *)linkFlags);
        }
        std::__cxx11::string::~string((string *)&sFlagVar);
      }
    }
    std::__cxx11::string::~string((string *)&linkLanguage);
    goto LAB_0032bc06;
  case 1:
    GetStaticLibraryFlags(this,linkFlags,&buildType,target->Target);
    goto LAB_0032bc06;
  case 2:
    pcVar4 = "CMAKE_SHARED_LINKER_FLAGS";
    break;
  case 3:
    pcVar4 = "CMAKE_MODULE_LINKER_FLAGS";
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&linkLanguage,pcVar4,(allocator *)&sFlagVar);
  cmMakefile::GetSafeDefinition(pcVar1,&linkLanguage);
  std::__cxx11::string::assign((char *)linkFlags);
  std::__cxx11::string::~string((string *)&linkLanguage);
  std::__cxx11::string::append((char *)linkFlags);
  if (buildType._M_string_length != 0) {
    std::__cxx11::string::string((string *)&linkLanguage,pcVar4,(allocator *)&sFlagVar);
    std::__cxx11::string::append((char *)&linkLanguage);
    std::__cxx11::string::append((string *)&linkLanguage);
    cmMakefile::GetSafeDefinition(this->Makefile,&linkLanguage);
    std::__cxx11::string::append((char *)linkFlags);
    std::__cxx11::string::append((char *)linkFlags);
    std::__cxx11::string::~string((string *)&linkLanguage);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&linkLanguage,"WIN32",(allocator *)&local_50);
  bVar2 = cmMakefile::IsOn(pcVar1,&linkLanguage);
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&sFlagVar,"CYGWIN",(allocator *)&local_70);
    bVar2 = cmMakefile::IsOn(pcVar1,&sFlagVar);
    if (bVar2) {
      std::__cxx11::string::~string((string *)&sFlagVar);
      goto LAB_0032b809;
    }
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&local_d8,"MINGW",&local_129);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&sFlagVar);
    std::__cxx11::string::~string((string *)&linkLanguage);
    if (!bVar2) {
      sFlagVar._M_dataplus._M_p = (pointer)0x0;
      sFlagVar._M_string_length = 0;
      sFlagVar.field_2._M_allocated_capacity = 0;
      cmGeneratorTarget::GetSourceFiles
                (target,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&sFlagVar,
                 &buildType);
      for (_Var6 = sFlagVar._M_dataplus; _Var6._M_p != (pointer)sFlagVar._M_string_length;
          _Var6._M_p = _Var6._M_p + 8) {
        this_00 = *(cmSourceFile **)_Var6._M_p;
        psVar5 = cmSourceFile::GetExtension_abi_cxx11_(this_00);
        bVar2 = std::operator==(psVar5,"def");
        if (bVar2) {
          pcVar1 = this->Makefile;
          std::__cxx11::string::string
                    ((string *)&linkLanguage,"CMAKE_LINK_DEF_FILE_FLAG",(allocator *)&local_d8);
          cmMakefile::GetSafeDefinition(pcVar1,&linkLanguage);
          std::__cxx11::string::append((char *)linkFlags);
          std::__cxx11::string::~string((string *)&linkLanguage);
          psVar5 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
          cmOutputConverter::Convert(&linkLanguage,&this->super_cmOutputConverter,psVar5,FULL,SHELL)
          ;
          std::__cxx11::string::append((string *)linkFlags);
          std::__cxx11::string::~string((string *)&linkLanguage);
          std::__cxx11::string::append((char *)linkFlags);
        }
      }
      std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                ((_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&sFlagVar);
    }
  }
  else {
LAB_0032b809:
    std::__cxx11::string::~string((string *)&linkLanguage);
  }
  std::__cxx11::string::string((string *)&linkLanguage,"LINK_FLAGS",(allocator *)&sFlagVar);
  pcVar4 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
  std::__cxx11::string::~string((string *)&linkLanguage);
  if (pcVar4 != (char *)0x0) {
    std::__cxx11::string::append((char *)linkFlags);
    std::__cxx11::string::append((char *)linkFlags);
  }
  if (buildType._M_string_length != 0) {
    std::__cxx11::string::string((string *)&linkLanguage,"LINK_FLAGS_",(allocator *)&sFlagVar);
    std::__cxx11::string::append((string *)&linkLanguage);
    pcVar4 = cmGeneratorTarget::GetProperty(target,&linkLanguage);
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::append((char *)linkFlags);
      std::__cxx11::string::append((char *)linkFlags);
    }
    std::__cxx11::string::~string((string *)&linkLanguage);
  }
  OutputLinkLibraries(this,linkLibs,frameworkPath,linkPath,target,false,false,SUB41(local_dc,0));
LAB_0032bc06:
  std::__cxx11::string::~string((string *)&buildType);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(std::string& linkLibs,
                                 std::string& flags,
                                 std::string& linkFlags,
                                 std::string& frameworkPath,
                                 std::string& linkPath,
                                 cmGeneratorTarget* target,
                                 bool useWatcomQuote)
{
  std::string buildType =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  buildType = cmSystemTools::UpperCase(buildType);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  switch(target->GetType())
    {
    case cmTarget::STATIC_LIBRARY:
      this->GetStaticLibraryFlags(linkFlags, buildType, target->Target);
      break;
    case cmTarget::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
    case cmTarget::SHARED_LIBRARY:
      {
      linkFlags = this->Makefile->GetSafeDefinition(libraryLinkVariable);
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = libraryLinkVariable;
        build += "_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      if(this->Makefile->IsOn("WIN32") &&
         !(this->Makefile->IsOn("CYGWIN") || this->Makefile->IsOn("MINGW")))
        {
        std::vector<cmSourceFile*> sources;
        target->GetSourceFiles(sources, buildType);
        for(std::vector<cmSourceFile*>::const_iterator i = sources.begin();
            i != sources.end(); ++i)
          {
          cmSourceFile* sf = *i;
          if(sf->GetExtension() == "def")
            {
            linkFlags +=
              this->Makefile->GetSafeDefinition("CMAKE_LINK_DEF_FILE_FLAG");
            linkFlags += this->Convert(sf->GetFullPath(),
                                       FULL, SHELL);
            linkFlags += " ";
            }
          }
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      }
      break;
    case cmTarget::EXECUTABLE:
      {
      linkFlags +=
        this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
      linkFlags += " ";
      if(!buildType.empty())
        {
        std::string build = "CMAKE_EXE_LINKER_FLAGS_";
        build += buildType;
        linkFlags += this->Makefile->GetSafeDefinition(build);
        linkFlags += " ";
        }
      std::string linkLanguage = target->Target->GetLinkerLanguage(buildType);
      if(linkLanguage.empty())
        {
        cmSystemTools::Error
          ("CMake can not determine linker language for target: ",
           target->Target->GetName().c_str());
        return;
        }
      this->AddLanguageFlags(flags, linkLanguage, buildType);
      this->OutputLinkLibraries(linkLibs, frameworkPath, linkPath,
                                *target, false, false, useWatcomQuote);
      if(cmSystemTools::IsOn
         (this->Makefile->GetDefinition("BUILD_SHARED_LIBS")))
        {
        std::string sFlagVar = std::string("CMAKE_SHARED_BUILD_")
          + linkLanguage + std::string("_FLAGS");
        linkFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        linkFlags += " ";
        }
      if ( target->GetPropertyAsBool("WIN32_EXECUTABLE") )
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_WIN32_EXE");
        linkFlags += " ";
        }
      else
        {
        linkFlags +=
          this->Makefile->GetSafeDefinition("CMAKE_CREATE_CONSOLE_EXE");
        linkFlags += " ";
        }
      if (target->Target->IsExecutableWithExports())
        {
        std::string exportFlagVar = "CMAKE_EXE_EXPORTS_";
        exportFlagVar += linkLanguage;
        exportFlagVar += "_FLAG";

        linkFlags +=
          this->Makefile->GetSafeDefinition(exportFlagVar);
        linkFlags += " ";
        }
      const char* targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if(targetLinkFlags)
        {
        linkFlags += targetLinkFlags;
        linkFlags += " ";
        }
      if(!buildType.empty())
        {
        std::string configLinkFlags = "LINK_FLAGS_";
        configLinkFlags += buildType;
        targetLinkFlags = target->GetProperty(configLinkFlags);
        if(targetLinkFlags)
          {
          linkFlags += targetLinkFlags;
          linkFlags += " ";
          }
        }
      }
      break;
    default:
      break;
    }
}